

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O1

void allphone_backtrace(allphone_search_t *allphs,int32 f,int32 *out_score)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  long *plVar4;
  undefined2 *ptr;
  glist_t pgVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  allphone_clear_segments(allphs);
  iVar2 = allphs->history->n_valid;
  do {
    iVar8 = iVar2;
    iVar2 = iVar8 + -1;
    iVar9 = f;
    if (iVar8 < 2) break;
    pvVar3 = blkarray_list_get(allphs->history,iVar2);
    iVar9 = *(int *)((long)pvVar3 + 0x10);
  } while (f < iVar9);
  if (0 < iVar8) {
    if (iVar2 == 0) {
      iVar6 = -0x80000000;
      iVar8 = -1;
    }
    else {
      iVar7 = -0x80000000;
      iVar10 = -1;
      do {
        pvVar3 = blkarray_list_get(allphs->history,iVar2);
        iVar6 = *(int *)((long)pvVar3 + 8);
        iVar8 = iVar2;
        if (*(int *)((long)pvVar3 + 8) <= iVar7 || *(int *)((long)pvVar3 + 0x10) != iVar9) {
          iVar6 = iVar7;
          iVar8 = iVar10;
        }
      } while ((*(int *)((long)pvVar3 + 0x10) == iVar9) &&
              (bVar1 = 1 < iVar2, iVar7 = iVar6, iVar2 = iVar2 + -1, iVar10 = iVar8, bVar1));
    }
    if (-1 < iVar8) {
      if (out_score != (int32 *)0x0) {
        *out_score = iVar6;
      }
      if (iVar8 != 0) {
        do {
          plVar4 = (long *)blkarray_list_get(allphs->history,iVar8);
          ptr = (undefined2 *)
                __ckd_calloc__(1,0x14,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                               ,0x336);
          *ptr = *(undefined2 *)(*plVar4 + 0x5c);
          if (*(int32 *)((long)plVar4 + 0x14) < 1) {
            iVar2 = 0;
          }
          else {
            pvVar3 = blkarray_list_get(allphs->history,*(int32 *)((long)plVar4 + 0x14));
            iVar2 = *(int *)((long)pvVar3 + 0x10) + 1;
          }
          *(int *)(ptr + 2) = iVar2;
          *(int *)(ptr + 4) = (int)plVar4[2];
          iVar2 = (int)plVar4[1];
          if (0 < *(int32 *)((long)plVar4 + 0x14)) {
            pvVar3 = blkarray_list_get(allphs->history,*(int32 *)((long)plVar4 + 0x14));
            iVar2 = iVar2 - *(int *)((long)pvVar3 + 8);
          }
          iVar9 = *(int *)((long)plVar4 + 0xc);
          *(int *)(ptr + 6) = iVar2 - iVar9;
          *(int *)(ptr + 8) = iVar9;
          pgVar5 = glist_add_ptr(allphs->segments,ptr);
          allphs->segments = pgVar5;
          iVar8 = *(int *)((long)plVar4 + 0x14);
        } while (0 < iVar8);
      }
    }
  }
  return;
}

Assistant:

static void
allphone_backtrace(allphone_search_t * allphs, int32 f, int32 *out_score)
{
    int32 best, hist_idx, best_idx;
    int32 frm, last_frm;
    history_t *h;
    phseg_t *s;

    /* Clear old list */
    allphone_clear_segments(allphs);

    frm = last_frm = f;
    /* Find the first history entry for the requested frame */
    hist_idx = blkarray_list_n_valid(allphs->history) - 1;
    while (hist_idx > 0) {
        h = blkarray_list_get(allphs->history, hist_idx);
        if (h->ef <= f) {
            frm = last_frm = h->ef;
            break;
        }
        hist_idx--;
    }

    if (hist_idx < 0)
        return;

    /* Find bestscore */
    best = MAX_NEG_INT32;
    best_idx = -1;
    while (frm == last_frm && hist_idx > 0) {
        h = blkarray_list_get(allphs->history, hist_idx);
        frm = h->ef;
        if (h->score > best && frm == last_frm) {
            best = h->score;
            best_idx = hist_idx;
        }
        hist_idx--;
    }

    if (best_idx < 0)
        return;

    if (out_score)
        *out_score = best;

    /* Backtrace */
    while (best_idx > 0) {
        h = blkarray_list_get(allphs->history, best_idx);
        s = (phseg_t *) ckd_calloc(1, sizeof(phseg_t));
        s->ci = h->phmm->ci;
        s->sf =
            (h->hist >
             0) ? ((history_t *) blkarray_list_get(allphs->history,
                                                   h->hist))->ef + 1 : 0;
        s->ef = h->ef;
        s->score = ascore(allphs, h);
        s->tscore = h->tscore;
        allphs->segments = glist_add_ptr(allphs->segments, s);

        best_idx = h->hist;
    }

    return;
}